

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.cpp
# Opt level: O1

void __thiscall CRIPEMD160::Finalize(CRIPEMD160 *this,uchar *hash)

{
  long in_FS_OFFSET;
  uchar sizedesc [8];
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = this->bytes * 8;
  Write(this,Finalize::pad,(ulong)(0x37U - (int)this->bytes & 0x3f) + 1);
  Write(this,(uchar *)&local_28,8);
  *(uint32_t *)hash = this->s[0];
  *(uint32_t *)(hash + 4) = this->s[1];
  *(uint32_t *)(hash + 8) = this->s[2];
  *(uint32_t *)(hash + 0xc) = this->s[3];
  *(uint32_t *)(hash + 0x10) = this->s[4];
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRIPEMD160::Finalize(unsigned char hash[OUTPUT_SIZE])
{
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    WriteLE64(sizedesc, bytes << 3);
    Write(pad, 1 + ((119 - (bytes % 64)) % 64));
    Write(sizedesc, 8);
    WriteLE32(hash, s[0]);
    WriteLE32(hash + 4, s[1]);
    WriteLE32(hash + 8, s[2]);
    WriteLE32(hash + 12, s[3]);
    WriteLE32(hash + 16, s[4]);
}